

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_1::getIVec3
          (anon_unknown_1 *this,Functions *gl,deUint32 pname)

{
  glGetIntegeri_vFunc p_Var1;
  GLuint GVar2;
  deUint32 dVar3;
  GLenum err;
  int *piVar4;
  char *msg;
  int extraout_EDX;
  Enum<int,_2UL> EVar5;
  IVec3 IVar6;
  GetNameFunc local_90;
  int local_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  GLuint local_20;
  deUint32 local_1c;
  int ndx;
  deUint32 pname_local;
  Functions *gl_local;
  IVec3 *value;
  
  local_1c = pname;
  _ndx = gl;
  gl_local = (Functions *)this;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,-1);
  for (local_20 = 0; dVar3 = local_1c, GVar2 = local_20, (int)local_20 < 3; local_20 = local_20 + 1)
  {
    p_Var1 = _ndx->getIntegeri_v;
    piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)this,local_20);
    (*p_Var1)(dVar3,GVar2,piVar4);
  }
  err = (*_ndx->getError)();
  EVar5 = glu::getGettableStateStr(local_1c);
  local_90 = EVar5.m_getName;
  local_88 = EVar5.m_value;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_80,&local_90);
  std::operator+(&local_60,"glGetIntegeri_v(",&local_80);
  std::operator+(&local_40,&local_60,")");
  msg = (char *)std::__cxx11::string::c_str();
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                  ,0x51);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  IVar6.m_data[2] = extraout_EDX;
  IVar6.m_data._0_8_ = this;
  return (IVec3)IVar6.m_data;
}

Assistant:

static tcu::IVec3 getIVec3 (const glw::Functions& gl, deUint32 pname)
{
	tcu::IVec3 value(-1);
	for (int ndx = 0; ndx < 3; ndx++)
		gl.getIntegeri_v(pname, (glw::GLuint)ndx, &value[ndx]);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegeri_v(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	return value;
}